

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test::TestBody
          (DenseHashMapMoveTest_OperatorSqBck_InsertMoved_ValueMoveCount_Test *this)

{
  bool bVar1;
  data_type *this_00;
  AssertHelper *this_01;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  h;
  key_type *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  hasher *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int line;
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_fffffffffffffeb0;
  Type in_stack_fffffffffffffebc;
  Type type;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_108;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e0 [2];
  undefined4 local_bc;
  AssertionResult local_b8;
  uint local_a4;
  undefined4 local_8c;
  AssertionResult local_88;
  undefined4 local_78;
  A local_74;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_A>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::dense_hash_map(in_stack_fffffffffffffeb0,
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0,
                   (key_equal *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffe90);
  google::libc_allocator_with_realloc<std::pair<const_int,_A>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::set_empty_key((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  A::reset();
  A::A(&local_74,1);
  local_78 = 1;
  this_00 = google::
            dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
            ::operator[]((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                          *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  A::operator=(this_00,&local_74);
  local_8c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (char *)in_stack_fffffffffffffea0,
             (int *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             (int *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffec0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x107ddb9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,(char *)in_stack_fffffffffffffeb0
               ,in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x107de16);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107de84);
  if (local_a4 == 0) {
    local_bc = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (char *)in_stack_fffffffffffffea0,
               (int *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (int *)in_stack_fffffffffffffe90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
    type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffeb0 =
           (dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x107df35);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffeac,(char *)in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x107df92);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e000);
    if (local_a4 == 0) {
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (char *)in_stack_fffffffffffffea0,
                 (int *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (int *)in_stack_fffffffffffffe90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffea0 =
             (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x107e0b1);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,line,
                   (char *)in_stack_fffffffffffffea0);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
        testing::Message::~Message((Message *)0x107e10e);
      }
      local_a4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e179);
      if (local_a4 == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(line,in_stack_fffffffffffffea8),
                   (char *)in_stack_fffffffffffffea0,
                   (int *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (int *)in_stack_fffffffffffffe90);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffec0);
          this_01 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0x107e218);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffec0,type,(char *)in_stack_fffffffffffffeb0,line,
                     (char *)in_stack_fffffffffffffea0);
          testing::internal::AssertHelper::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          testing::internal::AssertHelper::~AssertHelper(this_01);
          testing::Message::~Message((Message *)0x107e266);
        }
        local_a4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107e2c8);
        if (local_a4 == 0) {
          local_a4 = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::~dense_hash_map((dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                     *)0x107e2ed);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, OperatorSqBck_InsertMoved_ValueMoveCount)
{
    dense_hash_map<int, A> h;
    h.set_empty_key(0);

    A::reset();
    h[1] = A(1);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(1, A::move_ctor);
    ASSERT_EQ(1, A::move_assign);
}